

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

int CfdCopyErrorState(void *source,void *destination)

{
  CfdException *except;
  bool in_stack_0000003f;
  void *in_stack_00000040;
  void *in_stack_00000048;
  CfdCapiManager *in_stack_00000050;
  
  cfd::Initialize();
  cfd::capi::CfdCapiManager::CopyHandle
            (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003f);
  return 0;
}

Assistant:

int CfdCopyErrorState(void* source, void* destination) {
  try {
    cfd::Initialize();
    cfd::capi::capi_instance.CopyHandle(source, destination, true);
    return kCfdSuccess;
  } catch (const CfdException& except) {
    return except.GetErrorCode();
  } catch (...) {
    return kCfdUnknownError;
  }
}